

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O0

boolean e_missed(entity *etmp,boolean chunks)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  int local_20;
  int misses;
  boolean chunks_local;
  entity *etmp_local;
  
  bVar2 = automiss(etmp);
  if (bVar2 != '\0') {
    return '\x01';
  }
  if ((etmp->edata->mflags1 & 1) != 0) {
    if (etmp->emon == &youmonst) {
      uVar1 = u.uprops[0x1f].extrinsic;
      if (u.uprops[0x1f].intrinsic == 0) {
joined_r0x0017a237:
        if (uVar1 == 0) {
          local_20 = 5;
          goto LAB_0017a2e5;
        }
      }
    }
    else if ((*(uint *)&etmp->emon->field_0x60 >> 0x12 & 1) != 0) {
      uVar1 = *(uint *)&etmp->emon->field_0x60 >> 0x13 & 1;
      goto joined_r0x0017a237;
    }
  }
  if ((etmp->edata->mlet == '\x05') ||
     ((etmp->emon == &youmonst &&
      (((u.uprops[0x12].intrinsic != 0 || (u.uprops[0x12].extrinsic != 0)) ||
       ((youmonst.data)->mlet == '\x05')))))) {
    local_20 = 3;
  }
  else if ((chunks == '\0') || (bVar2 = is_pool(level,etmp->ex,etmp->ey), bVar2 == '\0')) {
    local_20 = 0;
  }
  else {
    local_20 = 2;
  }
LAB_0017a2e5:
  bVar2 = is_db_wall(etmp->ex,etmp->ey);
  if (bVar2 != '\0') {
    local_20 = local_20 + -3;
  }
  iVar3 = rnd(8);
  return iVar3 <= local_20;
}

Assistant:

static boolean e_missed(struct entity *etmp, boolean chunks)
{
	int misses;

	if (automiss(etmp))
		return TRUE;

	if (is_flyer(etmp->edata) &&
	    (is_u(etmp)? !Sleeping :
	     (etmp->emon->mcanmove && !etmp->emon->msleeping)))
						 /* flying requires mobility */
		misses = 5;	/* out of 8 */
	else if (is_floater(etmp->edata) ||
		    (is_u(etmp) && Levitation))	 /* doesn't require mobility */
		misses = 3;
	else if (chunks && is_pool(level, etmp->ex, etmp->ey))
		misses = 2;				    /* sitting ducks */
	else
		misses = 0;

	if (is_db_wall(etmp->ex, etmp->ey))
		misses -= 3;				    /* less airspace */


	return (boolean)((misses >= rnd(8))? TRUE : FALSE);
}